

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O3

int x86MOV(uchar *stream,x86Size size,x86Reg index,int multiplier,x86Reg base,int shift,int num)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  
  if (size == sWORD) {
    if ((short)num != num) {
      __assert_fail("(short int)(num) == num",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                    ,0x374,"int x86MOV(unsigned char *, x86Size, x86Reg, int, x86Reg, int, int)");
    }
    pbVar1 = stream + 1;
    *stream = 'f';
    bVar2 = 8 < (int)base | (8 < (int)index) * '\x02';
    bVar5 = bVar2 != 0;
    if (bVar5) {
      *pbVar1 = bVar2 | 0x40;
    }
    pbVar1[bVar5] = 199;
    uVar3 = encodeAddress(pbVar1 + bVar5 + 1,index,multiplier,base,shift,0);
    iVar4 = (int)(pbVar1 + (ulong)uVar3 + (ulong)bVar5) + 3;
    *(short *)(pbVar1 + (ulong)uVar3 + (ulong)bVar5 + 1) = (short)num;
  }
  else if (size == sBYTE) {
    if ((char)(uchar)num != num) {
      __assert_fail("(char)(num) == num",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                    ,0x369,"int x86MOV(unsigned char *, x86Size, x86Reg, int, x86Reg, int, int)");
    }
    bVar2 = 8 < (int)base | (8 < (int)index) * '\x02';
    bVar5 = bVar2 != 0;
    if (bVar5) {
      *stream = bVar2 | 0x40;
    }
    stream[bVar5] = 0xc6;
    uVar3 = encodeAddress(stream + bVar5 + 1,index,multiplier,base,shift,0);
    iVar4 = (int)(stream + (ulong)uVar3 + (ulong)bVar5) + 2;
    (stream + (ulong)uVar3 + (ulong)bVar5)[1] = (uchar)num;
  }
  else {
    bVar2 = 8 < (int)base | (8 < (int)index) * '\x02' | (size == sQWORD) << 3;
    bVar5 = bVar2 != 0;
    if (bVar5) {
      *stream = bVar2 | 0x40;
    }
    stream[bVar5] = 199;
    uVar3 = encodeAddress(stream + bVar5 + 1,index,multiplier,base,shift,0);
    iVar4 = (int)(stream + (ulong)uVar3 + (ulong)bVar5) + 5;
    *(int *)(stream + (ulong)uVar3 + (ulong)bVar5 + 1) = num;
  }
  return iVar4 - (int)stream;
}

Assistant:

int x86MOV(unsigned char *stream, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift, int num)
{
	unsigned char *start = stream;

	if(size == sBYTE)
	{
		assert((char)(num) == num);

		stream += encodeRex(stream, false, rNONE, index, base);
		*stream++ = 0xc6;
		stream += encodeAddress(stream, index, multiplier, base, shift, 0);
		stream += encodeImmByte(stream, (char)num);

		return int(stream - start);
	}
	else if(size == sWORD)
	{
		assert((short int)(num) == num);

		*stream++ = 0x66;	// switch to word
		stream += encodeRex(stream, false, rNONE, index, base);
		*stream++ = 0xc7;

		stream += encodeAddress(stream, index, multiplier, base, shift, 0);
		stream += encodeImmWord(stream, (short)num);

		return int(stream - start);
	}

	stream += encodeRex(stream, size == sQWORD, rNONE, index, base);
	*stream++ = 0xc7;
	stream += encodeAddress(stream, index, multiplier, base, shift, 0);
	stream += encodeImmDword(stream, num);

	return int(stream - start);
}